

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O0

ares_status_t
ares_query_nolock(ares_channel_t *channel,char *name,ares_dns_class_t dnsclass,
                 ares_dns_rec_type_t type,ares_callback_dnsrec callback,void *arg,
                 unsigned_short *qid)

{
  undefined8 *arg_00;
  size_t local_78;
  ares_query_dnsrec_arg_t *qquery;
  ares_dns_record_t *paStack_48;
  ares_dns_flags_t flags;
  ares_dns_record_t *dnsrec;
  void *pvStack_38;
  ares_status_t status;
  void *arg_local;
  ares_callback_dnsrec callback_local;
  ares_dns_rec_type_t type_local;
  ares_dns_class_t dnsclass_local;
  char *name_local;
  ares_channel_t *channel_local;
  
  paStack_48 = (ares_dns_record_t *)0x0;
  qquery._4_4_ = 0;
  pvStack_38 = arg;
  arg_local = callback;
  callback_local._0_4_ = type;
  callback_local._4_4_ = dnsclass;
  _type_local = name;
  name_local = (char *)channel;
  if (((channel == (ares_channel_t *)0x0) || (name == (char *)0x0)) ||
     (callback == (ares_callback_dnsrec)0x0)) {
    dnsrec._4_4_ = ARES_EFORMERR;
    if (callback != (ares_callback_dnsrec)0x0) {
      (*callback)(arg,ARES_EFORMERR,0,(ares_dns_record_t *)0x0);
    }
    channel_local._4_4_ = dnsrec._4_4_;
  }
  else {
    if ((channel->flags & 8) == 0) {
      qquery._4_4_ = ARES_FLAG_RD;
    }
    if ((channel->flags & 0x100) == 0) {
      local_78 = 0;
    }
    else {
      local_78 = channel->ednspsz;
    }
    dnsrec._4_4_ = ares_dns_record_create_query
                             (&stack0xffffffffffffffb8,name,dnsclass,type,0,qquery._4_4_,local_78);
    if (dnsrec._4_4_ == ARES_SUCCESS) {
      arg_00 = (undefined8 *)ares_malloc(0x10);
      if (arg_00 == (undefined8 *)0x0) {
        dnsrec._4_4_ = ARES_ENOMEM;
        (*(code *)arg_local)(pvStack_38,0xf,0);
        ares_dns_record_destroy(paStack_48);
        channel_local._4_4_ = dnsrec._4_4_;
      }
      else {
        *arg_00 = arg_local;
        arg_00[1] = pvStack_38;
        dnsrec._4_4_ = ares_send_nolock((ares_channel_t *)name_local,(ares_server_t *)0x0,0,
                                        paStack_48,ares_query_dnsrec_cb,arg_00,qid);
        ares_dns_record_destroy(paStack_48);
        channel_local._4_4_ = dnsrec._4_4_;
      }
    }
    else {
      (*(code *)arg_local)(pvStack_38,dnsrec._4_4_,0);
      channel_local._4_4_ = dnsrec._4_4_;
    }
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_query_nolock(ares_channel_t *channel, const char *name,
                                ares_dns_class_t     dnsclass,
                                ares_dns_rec_type_t  type,
                                ares_callback_dnsrec callback, void *arg,
                                unsigned short *qid)
{
  ares_status_t            status;
  ares_dns_record_t       *dnsrec = NULL;
  ares_dns_flags_t         flags  = 0;
  ares_query_dnsrec_arg_t *qquery = NULL;

  if (channel == NULL || name == NULL || callback == NULL) {
    /* LCOV_EXCL_START: DefensiveCoding */
    status = ARES_EFORMERR;
    if (callback != NULL) {
      callback(arg, status, 0, NULL);
    }
    return status;
    /* LCOV_EXCL_STOP */
  }

  if (!(channel->flags & ARES_FLAG_NORECURSE)) {
    flags |= ARES_FLAG_RD;
  }

  status = ares_dns_record_create_query(
    &dnsrec, name, dnsclass, type, 0, flags,
    (size_t)(channel->flags & ARES_FLAG_EDNS) ? channel->ednspsz : 0);
  if (status != ARES_SUCCESS) {
    callback(arg, status, 0, NULL); /* LCOV_EXCL_LINE: OutOfMemory */
    return status;                  /* LCOV_EXCL_LINE: OutOfMemory */
  }

  qquery = ares_malloc(sizeof(*qquery));
  if (qquery == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    status = ARES_ENOMEM;
    callback(arg, status, 0, NULL);
    ares_dns_record_destroy(dnsrec);
    return status;
    /* LCOV_EXCL_STOP */
  }

  qquery->callback = callback;
  qquery->arg      = arg;

  /* Send it off.  qcallback will be called when we get an answer. */
  status = ares_send_nolock(channel, NULL, 0, dnsrec, ares_query_dnsrec_cb,
                            qquery, qid);

  ares_dns_record_destroy(dnsrec);
  return status;
}